

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cc
# Opt level: O0

void brotli::StoreCommands
               (uint8_t *literals,size_t num_literals,uint32_t *commands,size_t num_commands,
               size_t *storage_ix,uint8_t *storage)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint local_aec;
  uint8_t lit;
  uint32_t j;
  uint32_t insert;
  uint32_t extra;
  uint32_t code;
  uint32_t cmd;
  size_t i_2;
  size_t i_1;
  uint32_t cmd_histo [128];
  uint16_t cmd_bits [128];
  uint8_t cmd_depths [128];
  ulong local_740;
  size_t i;
  uint32_t lit_histo [256];
  uint16_t lit_bits [256];
  uint8_t lit_depths [256];
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t num_commands_local;
  uint32_t *commands_local;
  size_t num_literals_local;
  uint8_t *literals_local;
  
  memset(lit_bits + 0xfc,0,0x100);
  memset(lit_histo + 0xfe,0,0x200);
  memset(&i,0,0x400);
  for (local_740 = 0; local_740 < num_literals; local_740 = local_740 + 1) {
    lit_histo[(ulong)literals[local_740] - 2] = lit_histo[(ulong)literals[local_740] - 2] + 1;
  }
  BuildAndStoreHuffmanTreeFast
            ((uint32_t *)&i,num_literals,8,(uint8_t *)(lit_bits + 0xfc),
             (uint16_t *)(lit_histo + 0xfe),storage_ix,storage);
  memset(cmd_bits + 0x7c,0,0x80);
  memset(cmd_histo + 0x7e,0,0x100);
  memset(&i_1,0,0x200);
  for (i_2 = 0; i_2 < num_commands; i_2 = i_2 + 1) {
    cmd_histo[(ulong)(commands[i_2] & 0xff) - 2] = cmd_histo[(ulong)(commands[i_2] & 0xff) - 2] + 1;
  }
  i_1._4_4_ = i_1._4_4_ + 1;
  cmd_histo[0] = cmd_histo[0] + 1;
  cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
  cmd_histo[0x52] = cmd_histo[0x52] + 1;
  BuildAndStoreCommandPrefixCode
            ((uint32_t *)&i_1,(uint8_t *)(cmd_bits + 0x7c),(uint16_t *)(cmd_histo + 0x7e),storage_ix
             ,storage);
  num_literals_local = (size_t)literals;
  for (_code = 0; _code < num_commands; _code = _code + 1) {
    uVar2 = commands[_code] & 0xff;
    uVar3 = commands[_code] >> 8;
    WriteBits((ulong)*(byte *)((long)cmd_bits + (ulong)uVar2 + 0xf8),
              (ulong)cmd_bits[(ulong)uVar2 - 4],storage_ix,storage);
    WriteBits((ulong)StoreCommands::kNumExtraBits[uVar2],(ulong)uVar3,storage_ix,storage);
    if (uVar2 < 0x18) {
      uVar1 = StoreCommands::kInsertOffset[uVar2];
      for (local_aec = 0; local_aec < uVar1 + uVar3; local_aec = local_aec + 1) {
        WriteBits((ulong)*(byte *)((long)lit_bits + (ulong)*(byte *)num_literals_local + 0x1f8),
                  (ulong)lit_bits[(ulong)*(byte *)num_literals_local - 4],storage_ix,storage);
        num_literals_local = num_literals_local + 1;
      }
    }
  }
  return;
}

Assistant:

void StoreCommands(const uint8_t* literals, const size_t num_literals,
                   const uint32_t* commands, const size_t num_commands,
                   size_t* storage_ix, uint8_t* storage) {
  uint8_t lit_depths[256] = { 0 };
  uint16_t lit_bits[256] = { 0 };
  uint32_t lit_histo[256] = { 0 };
  for (size_t i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BuildAndStoreHuffmanTreeFast(lit_histo, num_literals,
                               /* max_bits = */ 8,
                               lit_depths, lit_bits,
                               storage_ix, storage);

  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  for (size_t i = 0; i < num_commands; ++i) {
    ++cmd_histo[commands[i] & 0xff];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  for (size_t i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xff;
    const uint32_t extra = cmd >> 8;
    WriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    WriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      for (uint32_t j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        WriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}